

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parseInstrument(Parser *this,QString *data,qsizetype offset)

{
  bool bVar1;
  QString *this_00;
  qsizetype qVar2;
  qsizetype qVar3;
  Function *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype lastBraceIndex;
  qsizetype braceIndex;
  int spaceIndex;
  qsizetype beginOfFunctionMarker;
  qsizetype classMarker;
  qsizetype endOfProvider;
  qsizetype beginOfProvider;
  char16_t *str;
  QString end;
  QString begin;
  QString provider;
  Function func;
  parameter_type in_stack_fffffffffffffda8;
  Function *in_stack_fffffffffffffdb0;
  QString *in_stack_fffffffffffffdb8;
  QChar c;
  Function *this_01;
  Function *position;
  QString *in_stack_fffffffffffffde0;
  QString *in_stack_fffffffffffffde8;
  QLatin1Char local_17b [100];
  QLatin1Char local_117 [4];
  QLatin1Char local_113 [32];
  QLatin1Char local_f3 [3];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  QLatin1Char local_bb [3];
  QArrayDataPointer<char16_t> local_b8 [3];
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_58 [73];
  QLatin1Char local_f [4];
  QLatin1Char local_b [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RSI;
  QLatin1Char::QLatin1Char(local_b,'(');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffffdb0,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffdb8 >> 0x38));
  QString::indexOf(in_stack_fffffffffffffdb8,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                   (qsizetype)in_stack_fffffffffffffdb0,
                   (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  position = in_RSI;
  QLatin1Char::QLatin1Char(local_f,')');
  QChar::QChar<QLatin1Char,_true>
            ((QChar *)in_stack_fffffffffffffdb0,
             (QLatin1Char)(char)((ulong)in_stack_fffffffffffffdb8 >> 0x38));
  QString::indexOf(in_stack_fffffffffffffdb8,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                   (qsizetype)in_stack_fffffffffffffdb0,
                   (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  memset(local_58,0xaa,0x48);
  Function::Function(in_stack_fffffffffffffdb0);
  local_70 = 0xaaaaaaaaaaaaaaaa;
  local_68 = 0xaaaaaaaaaaaaaaaa;
  local_60 = 0xaaaaaaaaaaaaaaaa;
  QString::mid(in_RDI,(qsizetype)position,(qsizetype)this_01);
  QString::simplified(&in_stack_fffffffffffffda8->className);
  QString::~QString((QString *)0x10a347);
  bVar1 = ::operator!=(&in_stack_fffffffffffffdb0->className,&in_stack_fffffffffffffda8->className);
  if (!bVar1) {
    in_stack_fffffffffffffdb0 = in_RSI;
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_b8,(Data *)0x0,L"::",2);
    QString::QString(&in_stack_fffffffffffffdb0->className,(DataPointer *)in_stack_fffffffffffffda8)
    ;
    this_00 = (QString *)
              QString::indexOf(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,(qsizetype)in_RDI
                               ,(CaseSensitivity)((ulong)position >> 0x20));
    QString::~QString((QString *)0x10a410);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)in_stack_fffffffffffffdb0);
    QLatin1Char::QLatin1Char(local_bb,'{');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffdb0,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
    QString::indexOf(this_00,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                     (qsizetype)in_stack_fffffffffffffdb0,
                     (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    local_d8 = 0xaaaaaaaaaaaaaaaa;
    local_d0 = 0xaaaaaaaaaaaaaaaa;
    local_c8 = 0xaaaaaaaaaaaaaaaa;
    QString::mid(in_RDI,(qsizetype)position,(qsizetype)this_01);
    local_f0 = 0xaaaaaaaaaaaaaaaa;
    local_e8 = 0xaaaaaaaaaaaaaaaa;
    local_e0 = 0xaaaaaaaaaaaaaaaa;
    QString::mid(in_RDI,(qsizetype)position,(qsizetype)this_01);
    QLatin1Char::QLatin1Char(local_f3,' ');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffdb0,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
    qVar2 = QString::lastIndexOf
                      (&in_stack_fffffffffffffdb0->className,
                       (QChar)(char16_t)((ulong)this_00 >> 0x30),
                       (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    if ((int)qVar2 == -1) {
      QString::operator=(&in_stack_fffffffffffffdb0->className,&in_stack_fffffffffffffda8->className
                        );
    }
    else {
      in_stack_fffffffffffffda8 = (parameter_type)(long)((int)qVar2 + 1);
      QString::length((QString *)0x10a5ab);
      QString::mid(in_RDI,(qsizetype)position,(qsizetype)this_01);
      QString::operator=(&in_stack_fffffffffffffdb0->className,&in_stack_fffffffffffffda8->className
                        );
      QString::~QString((QString *)0x10a5f5);
    }
    QLatin1Char::QLatin1Char(local_113,'(');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffdb0,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
    qVar2 = QString::indexOf(this_00,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                             (qsizetype)in_stack_fffffffffffffdb0,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    QLatin1Char::QLatin1Char(local_117,' ');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffdb0,(QLatin1Char)(char)((ulong)this_00 >> 0x38));
    qVar3 = QString::indexOf(this_00,(QChar)(char16_t)((ulong)in_RDI >> 0x30),
                             (qsizetype)in_stack_fffffffffffffdb0,
                             (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    c.ucs = (char16_t)((ulong)this_00 >> 0x30);
    if ((int)qVar3 < qVar2) {
      QString::left(&this_01->className,(qsizetype)in_RSI);
      QString::simplified(&in_stack_fffffffffffffda8->className);
      QString::operator=(&in_stack_fffffffffffffdb0->className,&in_stack_fffffffffffffda8->className
                        );
      QString::~QString((QString *)0x10a6e9);
      QString::~QString((QString *)0x10a6f6);
    }
    else {
      QString::left(&this_01->className,(qsizetype)in_RSI);
      QString::simplified(&in_stack_fffffffffffffda8->className);
      QString::operator=(&in_stack_fffffffffffffdb0->className,&in_stack_fffffffffffffda8->className
                        );
      QString::~QString((QString *)0x10a74d);
      QString::~QString((QString *)0x10a75a);
    }
    QLatin1Char::QLatin1Char(local_17b,')');
    QChar::QChar<QLatin1Char,_true>
              ((QChar *)in_stack_fffffffffffffdb0,(QLatin1Char)(char)((ushort)c.ucs >> 8));
    QString::lastIndexOf
              (&in_stack_fffffffffffffdb0->className,c,
               (CaseSensitivity)((ulong)in_stack_fffffffffffffda8 >> 0x20));
    QString::mid(in_RDI,(qsizetype)position,(qsizetype)this_01);
    QString::simplified(&in_stack_fffffffffffffda8->className);
    QString::operator=(&in_stack_fffffffffffffdb0->className,&in_stack_fffffffffffffda8->className);
    QString::~QString((QString *)0x10a807);
    QString::~QString((QString *)0x10a814);
    QList<Function>::push_back
              ((QList<Function> *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    QString::~QString((QString *)0x10a833);
    QString::~QString((QString *)0x10a840);
  }
  QString::~QString((QString *)0x10a855);
  Function::~Function(in_stack_fffffffffffffdb0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Parser::parseInstrument(const QString &data, qsizetype offset)
{
    qsizetype beginOfProvider = data.indexOf(QLatin1Char('('), offset);
    qsizetype endOfProvider = data.indexOf(QLatin1Char(')'), beginOfProvider);
    Function func;
    QString provider = data.mid(beginOfProvider + 1, endOfProvider - beginOfProvider - 1).simplified();
    if (provider != m_provider)
        return;

    qsizetype classMarker = data.indexOf(QStringLiteral("::"), endOfProvider);
    qsizetype beginOfFunctionMarker = data.indexOf(QLatin1Char('{'), classMarker);
    QString begin = data.mid(endOfProvider + 1, classMarker - endOfProvider - 1);
    QString end = data.mid(classMarker + 2, beginOfFunctionMarker - classMarker - 2);
    int spaceIndex = begin.lastIndexOf(QLatin1Char(' '));
    if (spaceIndex == -1)
        func.className = begin;
    else
        func.className = begin.mid(spaceIndex + 1, begin.length() - spaceIndex - 1);
    qsizetype braceIndex = end.indexOf(QLatin1Char('('));
    spaceIndex = end.indexOf(QLatin1Char(' '));
    if (spaceIndex < braceIndex)
        func.functionName = end.left(spaceIndex).simplified();
    else
        func.functionName = end.left(braceIndex).simplified();

    qsizetype lastBraceIndex = end.lastIndexOf(QLatin1Char(')'));
    func.functionParameters = end.mid(braceIndex + 1, lastBraceIndex - braceIndex - 1).simplified();

    DEBUGPRINTF(printf("tracepointgen: %s(%s)\n", qPrintable(func.functionName), qPrintable(func.functionParameters)));

    m_functions.push_back(func);
}